

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue v_00;
  long lVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar5;
  JSFloat64Union u_1;
  anon_union_4_2_f9ece18f u;
  double d;
  uint32_t v_1;
  int32_t v;
  uint64_t v64;
  int shift;
  int final;
  int k;
  int len;
  JSObject *p;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff68;
  int64_t in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  JSValueUnion in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  ulong local_58;
  int in_stack_ffffffffffffffb0;
  int local_48;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar5.tag._0_4_ = in_stack_ffffffffffffff78;
  JVar5.u.ptr = (void *)in_stack_ffffffffffffff70;
  JVar5.tag._4_4_ = in_stack_ffffffffffffff7c;
  iVar2 = js_typed_array_get_length_internal((JSContext *)in_stack_ffffffffffffff68.ptr,JVar5);
  lVar1 = local_10;
  if (iVar2 < 0) {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 6;
  }
  else {
    if (*(short *)((long)in_RSI.ptr + 6) == 0x15) {
      JVar5 = JS_DupValue(in_RDI,*in_R8);
      in_stack_ffffffffffffff90 = JVar5.u;
      in_stack_ffffffffffffff98 = JVar5.tag;
      iVar3 = JS_ToUint8ClampFree((JSContext *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  (int32_t *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  JVar5);
      if (iVar3 != 0) {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
        return _local_10;
      }
      local_58 = (ulong)in_stack_ffffffffffffffa4;
    }
    else if (*(ushort *)((long)in_RSI.ptr + 6) < 0x1c) {
      val.tag = in_stack_ffffffffffffff70;
      val.u.ptr = in_stack_ffffffffffffff68.ptr;
      iVar3 = JS_ToUint32(in_stack_ffffffffffffff60,
                          (uint32_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          val);
      if (iVar3 != 0) {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
        return _local_10;
      }
      local_58 = (ulong)in_stack_ffffffffffffff8c;
    }
    else {
      val_00.u._4_4_ = in_stack_ffffffffffffff8c;
      val_00.u.int32 = in_stack_ffffffffffffff88;
      val_00.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
      iVar3 = JS_ToFloat64((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           val_00);
      if (iVar3 != 0) {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
        return _local_10;
      }
      if (*(short *)((long)in_RSI.ptr + 6) == 0x1c) {
        local_58 = (ulong)(uint)(float)(double)CONCAT44(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80);
      }
      else {
        local_58 = CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      }
    }
    local_48 = 0;
    if ((in_ECX < 2) ||
       (val_01.tag._0_4_ = in_stack_ffffffffffffffa0,
       val_01.u.ptr = (void *)in_stack_ffffffffffffff98,
       val_01.tag._4_4_ = in_stack_ffffffffffffffa4,
       iVar3 = JS_ToInt32Clamp((JSContext *)in_stack_ffffffffffffff90.ptr,
                               (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               val_01,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                               in_stack_ffffffffffffffb0), iVar3 == 0)) {
      if ((in_ECX < 3) ||
         ((iVar3 = JS_IsUndefined(in_R8[2]), iVar3 != 0 ||
          (val_02.tag._0_4_ = in_stack_ffffffffffffffa0,
          val_02.u.ptr = (void *)in_stack_ffffffffffffff98,
          val_02.tag._4_4_ = in_stack_ffffffffffffffa4,
          iVar3 = JS_ToInt32Clamp((JSContext *)in_stack_ffffffffffffff90.ptr,
                                  (int *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88),val_02,
                                  in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                                  in_stack_ffffffffffffffb0), iVar3 == 0)))) {
        BVar4 = typed_array_is_detached(in_RDI,(JSObject *)in_RSI.ptr);
        if (BVar4 == 0) {
          switch("includes"[(ulong)*(ushort *)((long)in_RSI.ptr + 6) + 1]) {
          case '\0':
            if (0 < iVar2) {
              memset(*(void **)((long)in_RSI.ptr + 0x38),(uint)local_58 & 0xff,(long)iVar2);
            }
            break;
          case '\x01':
            for (; local_48 < iVar2; local_48 = local_48 + 1) {
              *(short *)(*(long *)((long)in_RSI.ptr + 0x38) + (long)local_48 * 2) = (short)local_58;
            }
            break;
          case '\x02':
            for (; local_48 < iVar2; local_48 = local_48 + 1) {
              *(uint *)(*(long *)((long)in_RSI.ptr + 0x38) + (long)local_48 * 4) = (uint)local_58;
            }
            break;
          case '\x03':
            for (; local_48 < iVar2; local_48 = local_48 + 1) {
              *(ulong *)(*(long *)((long)in_RSI.ptr + 0x38) + (long)local_48 * 8) = local_58;
            }
            break;
          default:
            abort();
          }
          v_00.tag = in_RDX;
          v_00.u.ptr = in_RSI.ptr;
          _local_10 = JS_DupValue(in_RDI,v_00);
        }
        else {
          _local_10 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1c1cd8);
        }
      }
      else {
        local_10.ptr = (void *)(lVar1 << 0x20);
        local_8 = 6;
      }
    }
    else {
      local_10.ptr = (void *)(lVar1 << 0x20);
      local_8 = 6;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_fill(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, k, final, shift;
    uint64_t v64;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;
    p = JS_VALUE_GET_OBJ(this_val);

    if (p->class_id == JS_CLASS_UINT8C_ARRAY) {
        int32_t v;
        if (JS_ToUint8ClampFree(ctx, &v, JS_DupValue(ctx, argv[0])))
            return JS_EXCEPTION;
        v64 = v;
    } else if (p->class_id <= JS_CLASS_UINT32_ARRAY) {
        uint32_t v;
        if (JS_ToUint32(ctx, &v, argv[0]))
            return JS_EXCEPTION;
        v64 = v;
    } else
#ifdef CONFIG_BIGNUM
    if (p->class_id <= JS_CLASS_BIG_UINT64_ARRAY) {
        if (JS_ToBigInt64(ctx, (int64_t *)&v64, argv[0]))
            return JS_EXCEPTION;
    } else
#endif
    {
        double d;
        if (JS_ToFloat64(ctx, &d, argv[0]))
            return JS_EXCEPTION;
        if (p->class_id == JS_CLASS_FLOAT32_ARRAY) {
            union {
                float f;
                uint32_t u32;
            } u;
            u.f = d;
            v64 = u.u32;
        } else {
            JSFloat64Union u;
            u.d = d;
            v64 = u.u64;
        }
    }

    k = 0;
    if (argc > 1) {
        if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
            return JS_EXCEPTION;
    }

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    if (typed_array_is_detached(ctx, p))
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    
    shift = typed_array_size_log2(p->class_id);
    switch(shift) {
    case 0:
        if (k < final) {
            memset(p->u.array.u.uint8_ptr + k, v64, final - k);
        }
        break;
    case 1:
        for(; k < final; k++) {
            p->u.array.u.uint16_ptr[k] = v64;
        }
        break;
    case 2:
        for(; k < final; k++) {
            p->u.array.u.uint32_ptr[k] = v64;
        }
        break;
    case 3:
        for(; k < final; k++) {
            p->u.array.u.uint64_ptr[k] = v64;
        }
        break;
    default:
        abort();
    }
    return JS_DupValue(ctx, this_val);
}